

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshCache.cpp
# Opt level: O2

SNamedPath * __thiscall irr::scene::CMeshCache::getMeshName(CMeshCache *this,IMesh *mesh)

{
  IMesh *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  u32 i;
  ulong uVar4;
  undefined8 in_R9;
  long lVar5;
  undefined1 *puVar6;
  
  if (mesh != (IMesh *)0x0) {
    puVar6 = emptyNamedPath;
    lVar5 = 0;
    for (uVar4 = 0; lVar3 = *(long *)&(this->super_IMeshCache).field_0x8,
        uVar4 < ((*(long *)&(this->super_IMeshCache).field_0x10 - lVar3) / 0x48 & 0xffffffffU);
        uVar4 = uVar4 + 1) {
      pIVar1 = *(IMesh **)(lVar3 + 0x40 + lVar5);
      if (pIVar1 == mesh) {
LAB_001e9a3c:
        return (SNamedPath *)(lVar3 + lVar5);
      }
      if ((pIVar1 != (IMesh *)0x0) &&
         (iVar2 = (*pIVar1->_vptr_IMesh[0xd])(pIVar1,0,0xff,0xffffffff,0xffffffff,in_R9,puVar6),
         (IMesh *)CONCAT44(extraout_var,iVar2) == mesh)) {
        lVar3 = *(long *)&(this->super_IMeshCache).field_0x8;
        goto LAB_001e9a3c;
      }
      lVar5 = lVar5 + 0x48;
    }
  }
  return (SNamedPath *)emptyNamedPath;
}

Assistant:

const io::SNamedPath &CMeshCache::getMeshName(const IMesh *const mesh) const
{
	if (!mesh)
		return emptyNamedPath;

	for (u32 i = 0; i < Meshes.size(); ++i) {
		if (Meshes[i].Mesh == mesh || (Meshes[i].Mesh && Meshes[i].Mesh->getMesh(0) == mesh))
			return Meshes[i].NamedPath;
	}

	return emptyNamedPath;
}